

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O2

bool __thiscall EOPlus::Lexer::GetChar(Lexer *this,char *c)

{
  uint uVar1;
  long *plVar2;
  undefined1 auStack_a8 [80];
  undefined1 local_58 [64];
  
  plVar2 = (long *)std::istream::get((char *)this->is);
  uVar1 = *(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20);
  if (((uVar1 & 5) == 0) && (this->col = this->col + 1, *c == '\n')) {
    util::variant::variant((variant *)local_58);
    Token::Token((Token *)auStack_a8,NewLine,(variant *)local_58);
    std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::emplace_back<EOPlus::Token>
              (&(this->token_buffer).c,(Token *)auStack_a8);
    std::__cxx11::string::~string((string *)(auStack_a8 + 0x18));
    std::__cxx11::string::~string((string *)(local_58 + 0x10));
    this->row = this->row + 1;
    this->col = 0;
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool Lexer::GetChar(char& c)
	{
		if (!is.get(c))
			return false;

		++this->col;

		if (c == '\n')
		{
			this->token_buffer.push(Token(Token::NewLine));
			++this->row;
			this->col = 0;
		}

		return true;
	}